

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMethodOptions
          (Parser *this,LocationRecorder *parent_location,FileDescriptorProto *containing_file,
          int optionsFieldNumber,Message *mutable_options)

{
  TokenType TVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  LocationRecorder location;
  LocationRecorder local_58;
  Tokenizer *local_48;
  SourceCodeInfo *local_38;
  
  local_38 = (SourceCodeInfo *)mutable_options;
  ConsumeEndOfDeclaration(this,"{",parent_location);
  bVar3 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
  if (!bVar3) {
    TVar1 = (this->input_->current_).type;
    while (TVar1 != TYPE_END) {
      bVar3 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
      if (!bVar3) {
        LocationRecorder::LocationRecorder(&local_58,parent_location,optionsFieldNumber);
        bVar3 = ParseOption(this,&local_38->super_Message,&local_58,containing_file,OPTION_STATEMENT
                           );
        if (!bVar3) {
          SkipStatement(this);
        }
        LocationRecorder::~LocationRecorder(&local_58);
      }
      bVar3 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
      if (bVar3) {
        return bVar3;
      }
      TVar1 = (this->input_->current_).type;
    }
    local_58.parser_ = (Parser *)&stack0xffffffffffffffb8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Reached end of input in method options (missing \'}\').","");
    pEVar2 = this->error_collector_;
    if (pEVar2 != (ErrorCollector *)0x0) {
      (*pEVar2->_vptr_ErrorCollector[2])
                (pEVar2,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_58);
    }
    this->had_errors_ = true;
    if (local_58.parser_ != (Parser *)&stack0xffffffffffffffb8) {
      operator_delete(local_58.parser_,(ulong)((long)&(local_48->current_).type + 1));
    }
  }
  return bVar3;
}

Assistant:

bool Parser::ParseMethodOptions(const LocationRecorder& parent_location,
                                const FileDescriptorProto* containing_file,
                                const int optionsFieldNumber,
                                Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location,
                                optionsFieldNumber);
      if (!ParseOption(mutable_options, location,
                       containing_file, OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}